

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

_Bool ray_intersect_triangles_with_transform
                (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t,int *idx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  vec3 c;
  undefined1 auVar7 [16];
  _Bool _Var8;
  ulong uVar9;
  int iVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  vec3 p;
  vec3 q;
  vec3 a;
  vec3 b;
  float local_c8;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  float *local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  p.z = ro.z;
  auVar6._8_4_ = in_XMM0_Dc;
  auVar6._0_8_ = ro._0_8_;
  auVar6._12_4_ = in_XMM0_Dd;
  local_c8 = 3.4028235e+38;
  local_90 = t;
  if (0 < num_points) {
    local_ac = transform.m[8];
    local_b0 = transform.m[9];
    local_b4 = transform.m[10];
    local_b8 = transform.m[0xb];
    local_a8._0_4_ = rd.x;
    local_a8._4_4_ = rd.y;
    local_88._0_4_ = ro.x;
    local_88._4_4_ = ro.y;
    local_a8._4_4_ = local_a8._4_4_ + (float)local_88._4_4_;
    local_a8._0_4_ = (float)local_a8 + (float)local_88._0_4_;
    fStack_a0 = in_XMM2_Dc + in_XMM0_Dc;
    fStack_9c = in_XMM2_Dd + in_XMM0_Dd;
    local_48 = transform.m[3];
    fStack_44 = transform.m[7];
    fStack_40 = transform.m[5];
    fStack_3c = transform.m[6];
    local_58 = transform.m[2];
    fStack_54 = transform.m[6];
    fStack_50 = transform.m[4];
    fStack_4c = transform.m[5];
    local_68 = transform.m[0];
    fStack_64 = transform.m[4];
    fStack_60 = transform.m[2];
    fStack_5c = transform.m[3];
    local_78 = transform.m[1];
    fStack_74 = transform.m[5];
    fStack_70 = transform.m[3];
    fStack_6c = transform.m[4];
    pfVar11 = &points[2].z;
    local_c8 = 3.4028235e+38;
    iVar10 = 0;
    uVar9 = 0;
    local_88 = auVar6;
    do {
      auVar7 = local_88;
      auVar6 = _local_a8;
      fVar12 = (float)*(undefined8 *)(pfVar11 + -8);
      fVar14 = (float)((ulong)*(undefined8 *)(pfVar11 + -8) >> 0x20);
      fVar1 = pfVar11[-6];
      fVar13 = (float)*(undefined8 *)(pfVar11 + -5);
      fVar15 = (float)((ulong)*(undefined8 *)(pfVar11 + -5) >> 0x20);
      fVar2 = pfVar11[-3];
      uVar4 = ((vec3 *)(pfVar11 + -2))->x;
      uVar5 = ((vec3 *)(pfVar11 + -2))->y;
      fVar3 = *pfVar11;
      a.x = fVar1 * local_58 + fVar12 * local_68 + fVar14 * local_78 + local_48;
      a.y = fVar1 * fStack_54 + fVar12 * fStack_64 + fVar14 * fStack_74 + fStack_44;
      a.z = fVar14 * local_b0 + local_ac * fVar12 + local_b4 * fVar1 + local_b8;
      b.x = fVar2 * local_58 + fVar13 * local_68 + local_78 * fVar15 + local_48;
      b.y = fVar2 * fStack_54 + fVar13 * fStack_64 + fStack_74 * fVar15 + fStack_44;
      b.z = fVar15 * local_b0 + local_ac * fVar13 + local_b4 * fVar2 + local_b8;
      local_bc = 3.4028235e+38;
      c.y = fVar3 * fStack_54 + (float)uVar4 * fStack_64 + fStack_74 * (float)uVar5 + fStack_44;
      c.x = fVar3 * local_58 + (float)uVar4 * local_68 + local_78 * (float)uVar5 + local_48;
      c.z = fVar3 * fStack_50 + (float)uVar4 * fStack_60 + fStack_70 * (float)uVar5 + fStack_40;
      p.x = (float)local_88._0_4_;
      p.y = (float)local_88._4_4_;
      q.z = rd.z + p.z;
      q.x = (float)local_a8;
      q.y = local_a8._4_4_;
      _local_a8 = auVar6;
      local_88 = auVar7;
      _Var8 = intersect_segment_triangle(p,q,a,b,c,&local_bc);
      if ((_Var8) && (local_bc < local_c8)) {
        *idx = iVar10;
        local_c8 = local_bc;
      }
      uVar9 = uVar9 + 3;
      pfVar11 = pfVar11 + 9;
      iVar10 = iVar10 + 1;
    } while (uVar9 < (uint)num_points);
  }
  *local_90 = local_c8;
  return local_c8 < 3.4028235e+38;
}

Assistant:

bool ray_intersect_triangles_with_transform(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t, int *idx) { 
    float min_t = FLT_MAX;  

    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = vec3_apply_mat4(points[i + 0], 1, transform);
        vec3 tp1 = vec3_apply_mat4(points[i + 1], 1, transform);
        vec3 tp2 = vec3_apply_mat4(points[i + 2], 1, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            if (t0 < min_t) {
                min_t = t0;
                *idx = (i / 3);
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}